

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

int __thiscall
testing::internal::
ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest>::
AddTestSuiteInstantiation
          (ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest> *this,
          string *instantiation_name,undefined1 *func,undefined1 *name_func,char *file,int line)

{
  pointer *ppIVar1;
  pointer pIVar2;
  pointer pIVar3;
  pointer pIVar4;
  pointer pcVar5;
  size_type sVar6;
  size_type sVar7;
  undefined8 uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  pointer pIVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  char *extraout_RAX;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  pointer pIVar17;
  char *local_70;
  char *local_68;
  char local_60;
  undefined7 uStack_5f;
  size_type sStack_58;
  undefined1 *local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  int local_38;
  
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,instantiation_name,func + (long)instantiation_name);
  uStack_48._4_4_ = (undefined4)((ulong)file >> 0x20);
  local_40 = 0xcc6eed;
  uStack_3c = 0;
  pIVar3 = (this->instantiations_).
           super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest>::InstantiationInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar3 == (this->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pIVar4 = (this->instantiations_).
             super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest>::InstantiationInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_50 = name_func;
    local_38 = line;
    uStack_48 = file;
    if ((long)pIVar3 - (long)pIVar4 == 0x7fffffffffffffc0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar15 = (long)pIVar3 - (long)pIVar4 >> 6;
    uVar10 = 1;
    if (pIVar3 != pIVar4) {
      uVar10 = uVar15;
    }
    uVar14 = uVar10 + uVar15;
    if (0x1fffffffffffffe < uVar14) {
      uVar14 = 0x1ffffffffffffff;
    }
    if (CARRY8(uVar10,uVar15)) {
      uVar14 = 0x1ffffffffffffff;
    }
    if (uVar14 == 0) {
      pIVar11 = (pointer)0x0;
    }
    else {
      pIVar11 = (pointer)operator_new(uVar14 << 6);
      file = uStack_48;
    }
    uStack_48._4_4_ = (undefined4)((ulong)file >> 0x20);
    pIVar17 = pIVar11 + uVar15;
    pIVar2 = pIVar11 + uVar15;
    paVar12 = &(pIVar2->name).field_2;
    (pIVar2->name)._M_dataplus = (_Alloc_hider)paVar12;
    if (local_70 == &local_60) {
      paVar12->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
      *(size_type *)((long)&(pIVar2->name).field_2 + 8) = sStack_58;
    }
    else {
      (pIVar17->name)._M_dataplus = (_Alloc_hider)local_70;
      (pIVar17->name).field_2._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    }
    (pIVar17->name)._M_string_length = (size_type)local_68;
    local_68 = (char *)0x0;
    local_60 = '\0';
    *(ulong *)((long)&pIVar17->name_func + 4) = CONCAT44(local_40,uStack_48._4_4_);
    *(ulong *)((long)&pIVar17->file + 4) = CONCAT44(local_38,uStack_3c);
    pIVar17->generator = local_50;
    pIVar17->name_func = file;
    pIVar17 = pIVar11;
    if (pIVar3 != pIVar4) {
      paVar12 = &(pIVar4->name).field_2;
      paVar9 = &(pIVar11->name).field_2;
      do {
        paVar16 = paVar9;
        (&paVar16->_M_allocated_capacity)[-2] = (size_type)paVar16;
        pcVar5 = (((string *)(paVar12 + -1))->_M_dataplus)._M_p;
        if (paVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5) {
          sVar6 = *(size_type *)((long)paVar12 + 8);
          paVar16->_M_allocated_capacity = paVar12->_M_allocated_capacity;
          (&paVar16->_M_allocated_capacity)[1] = sVar6;
        }
        else {
          (&paVar16->_M_allocated_capacity)[-2] = (size_type)pcVar5;
          paVar16->_M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        (&paVar16->_M_allocated_capacity)[-1] = *(size_type *)((long)paVar12 + -8);
        (((string *)(paVar12 + -1))->_M_dataplus)._M_p = (pointer)paVar12;
        *(size_type *)((long)paVar12 + -8) = 0;
        paVar12->_M_local_buf[0] = '\0';
        sVar6 = paVar12[1]._M_allocated_capacity;
        sVar7 = *(size_type *)((long)paVar12 + 0x18);
        uVar8 = *(undefined8 *)((long)paVar12 + 0x24);
        *(undefined8 *)((long)paVar16 + 0x1c) = *(undefined8 *)((long)paVar12 + 0x1c);
        *(undefined8 *)((long)paVar16 + 0x24) = uVar8;
        (&paVar16->_M_allocated_capacity)[2] = sVar6;
        (&paVar16->_M_allocated_capacity)[3] = sVar7;
        pIVar17 = (pointer)(paVar12 + 3);
        paVar12 = paVar12 + 4;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar16->_M_allocated_capacity + 8);
      } while (pIVar17 != pIVar3);
      pIVar17 = (pointer)(&paVar16->_M_allocated_capacity + 6);
    }
    local_70 = &local_60;
    uStack_48 = file;
    if (pIVar4 != (pointer)0x0) {
      operator_delete(pIVar4);
    }
    (this->instantiations_).
    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest>::InstantiationInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = pIVar11;
    (this->instantiations_).
    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest>::InstantiationInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar17 + 1;
    (this->instantiations_).
    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest>::InstantiationInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pIVar11 + uVar14;
    pcVar13 = &local_60;
    if (local_70 != pcVar13) {
      operator_delete(local_70);
      pcVar13 = extraout_RAX;
    }
  }
  else {
    paVar12 = &(pIVar3->name).field_2;
    (pIVar3->name)._M_dataplus._M_p = (pointer)paVar12;
    if (local_70 == &local_60) {
      paVar12->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
      *(size_type *)((long)&(pIVar3->name).field_2 + 8) = sStack_58;
    }
    else {
      (pIVar3->name)._M_dataplus._M_p = local_70;
      (pIVar3->name).field_2._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    }
    (pIVar3->name)._M_string_length = (size_type)local_68;
    pIVar3->generator = name_func;
    pIVar3->name_func = file;
    *(ulong *)((long)&pIVar3->name_func + 4) = CONCAT44(0xcc6eed,uStack_48._4_4_);
    *(ulong *)((long)&pIVar3->file + 4) = (ulong)(uint)line << 0x20;
    ppIVar1 = &(this->instantiations_).
               super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1Convolve2DHighbdCompoundTest>::InstantiationInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
    pcVar13 = local_68;
  }
  return (int)pcVar13;
}

Assistant:

int AddTestSuiteInstantiation(const std::string& instantiation_name,
                                GeneratorCreationFunc* func,
                                ParamNameGeneratorFunc* name_func,
                                const char* file, int line) {
    instantiations_.push_back(
        InstantiationInfo(instantiation_name, func, name_func, file, line));
    return 0;  // Return value used only to run this method in namespace scope.
  }